

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandGlitch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint Prob;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  uint fVerbose;
  bool bVar4;
  float fVar5;
  uint local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fVerbose = 1;
  Prob = 8;
  local_3c = 4000;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"NPvh"), iVar2 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else {
          bVar4 = pNtk->ntkType == ABC_NTK_LOGIC;
          if (bVar4) {
            if (((bVar4) && (pNtk->ntkFunc == ABC_FUNC_MAP)) ||
               (iVar2 = Abc_NtkGetFaninMax(pNtk), iVar2 < 7)) {
              fVar5 = Abc_NtkMfsTotalGlitching(pNtk,local_3c,Prob,fVerbose);
              Abc_Print(1,"Glitching adds %7.2f %% of signal transitions, compared to switching.\n",
                        (double)fVar5);
            }
            else {
              puts("Currently computes glitching only for K-LUT networks with K <= 6.");
            }
            return 0;
          }
          pcVar3 = "This command can only be applied to a mapped logic network.\n";
        }
        iVar2 = -1;
        goto LAB_00253277;
      }
      if (iVar1 != 0x50) break;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-P\" should be followed by an integer.\n";
LAB_002531e2:
        Abc_Print(-1,pcVar3);
        goto LAB_002531f2;
      }
      Prob = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if ((int)Prob < 1) goto LAB_002531f2;
    }
    if (iVar1 != 0x4e) break;
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_002531e2;
    }
    local_3c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (0 < (int)local_3c);
LAB_002531f2:
  Abc_Print(-2,"usage: glitch [-NP <num>] [-vh]\n");
  Abc_Print(-2,"\t           comparing glitching activity to switching activity\n");
  Abc_Print(-2,
            "\t-N <num> : the number of random patterns to use (0 < num < 1000000) [default = %d]\n"
            ,(ulong)local_3c);
  Abc_Print(-2,"\t-P <num> : once in how many cycles an input changes its value [default = %d]\n",
            (ulong)Prob);
  pcVar3 = "yes";
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
  pcVar3 = "\t-h       : print the command usage\n";
  iVar2 = -2;
LAB_00253277:
  Abc_Print(iVar2,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandGlitch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int nPats    = 4000;
    int Prob     =    8;
    int fVerbose =    1;
    int c;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NPvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nPats = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPats < 1 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            Prob = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Prob < 1 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a mapped logic network.\n" );
        return 1;
    }
    if ( Abc_NtkIsMappedLogic(pNtk) || Abc_NtkGetFaninMax(pNtk) <= 6 )
        Abc_Print( 1, "Glitching adds %7.2f %% of signal transitions, compared to switching.\n", Abc_NtkMfsTotalGlitching(pNtk, nPats, Prob, fVerbose) );
    else
        printf( "Currently computes glitching only for K-LUT networks with K <= 6.\n" );
    return 0;

usage:
    Abc_Print( -2, "usage: glitch [-NP <num>] [-vh]\n" );
    Abc_Print( -2, "\t           comparing glitching activity to switching activity\n" );
    Abc_Print( -2, "\t-N <num> : the number of random patterns to use (0 < num < 1000000) [default = %d]\n", nPats );
    Abc_Print( -2, "\t-P <num> : once in how many cycles an input changes its value [default = %d]\n", Prob );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}